

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  gboolean gVar3;
  Filetree tree;
  char **in_RSI;
  int in_EDI;
  GSList *files;
  GSList *errors;
  int local_44;
  char **local_40;
  GSList *local_38;
  GSList *local_30;
  
  local_30 = (GSList *)0x0;
  local_38 = (GSList *)0x0;
  local_44 = in_EDI;
  local_40 = in_RSI;
  iVar2 = parse_global_args(&local_44,&local_40,entries,1);
  if (((iVar2 != 0) || (local_44 < 2)) || (help != 0)) {
    print_help();
    goto LAB_00102b8d;
  }
  __s1 = local_40[1];
  iVar2 = strcmp(__s1,"scan");
  if (iVar2 == 0) {
    gVar3 = loudness_scan_parse(&local_44,&local_40);
LAB_00102a24:
    bVar1 = true;
  }
  else {
    iVar2 = strcmp(__s1,"dump");
    if (iVar2 != 0) {
      iVar2 = strcmp(__s1,"--version");
      if (iVar2 == 0) goto LAB_00102b9c;
      gVar3 = 0;
      fprintf(_stderr,"Unknown mode \'%s\'\n",__s1);
      goto LAB_00102a24;
    }
    gVar3 = loudness_dump_parse(&local_44,&local_40);
    bVar1 = false;
  }
  if (gVar3 != 0) {
    if ((decode_to_file == (gchar *)0x0) || (local_44 == 2)) {
      input_init(*local_40,forced_plugin);
      scanner_init_common();
      setlocale(3,"");
      iVar2 = 0;
      setlocale(0,"");
      tree = filetree_init(local_40 + 1,(long)local_44 - 1,recursive,follow_symlinks,no_sort,
                           &local_30);
      g_slist_foreach(local_30,filetree_print_error,&verbose);
      g_slist_foreach(local_30,filetree_free_error,0);
      g_slist_free(local_30);
      filetree_file_list(tree,&local_38);
      filetree_remove_common_prefix(local_38);
      if (bVar1) {
        loudness_scan(local_38);
      }
      else {
        iVar2 = loudness_dump(local_38);
      }
      g_slist_foreach(local_38,filetree_free_list_entry,0);
      g_slist_free(local_38);
      filetree_destroy(tree);
      input_deinit();
      g_free(forced_plugin);
      return iVar2;
    }
    main_cold_1();
LAB_00102b9c:
    print_version();
    exit(0);
  }
LAB_00102b8d:
  exit(1);
}

Assistant:

int
main(int argc, char *argv[])
{
	GSList *errors = NULL;
	GSList *files = NULL;
	Filetree tree;
	int mode = 0;
	int mode_parsed = FALSE;
	int ret = 0;

	if (parse_global_args(&argc, &argv, entries, TRUE) || argc < 2 ||
	    help) {
		print_help();
		exit(EXIT_FAILURE);
	}
	if (!strcmp(argv[1], "scan")) {
		mode = LOUDNESS_MODE_SCAN;
		mode_parsed = loudness_scan_parse(&argc, &argv);
#ifdef USE_TAGLIB
	} else if (!strcmp(argv[1], "tag")) {
		mode = LOUDNESS_MODE_TAG;
		mode_parsed = loudness_tag_parse(&argc, &argv);
#endif
	} else if (!strcmp(argv[1], "dump")) {
		mode = LOUDNESS_MODE_DUMP;
		mode_parsed = loudness_dump_parse(&argc, &argv);
	} else if (!strcmp(argv[1], "--version")) {
		print_version();
		exit(EXIT_SUCCESS);
	} else {
		fprintf(stderr, "Unknown mode '%s'\n", argv[1]);
	}
	if (!mode_parsed) {
		exit(EXIT_FAILURE);
	}
	if (decode_to_file && argc - 1 != 1) {
		fprintf(stderr, "Cannot decode more than one file\n");
		exit(EXIT_FAILURE);
	}

	input_init(argv[0], forced_plugin);
	scanner_init_common();

	setlocale(LC_COLLATE, "");
	setlocale(LC_CTYPE, "");
	tree = filetree_init(&argv[1], (size_t)(argc - 1), recursive,
	    follow_symlinks, no_sort, &errors);

	g_slist_foreach(errors, filetree_print_error, &verbose);
	g_slist_foreach(errors, filetree_free_error, NULL);
	g_slist_free(errors);

	filetree_file_list(tree, &files);
	filetree_remove_common_prefix(files);

	switch (mode) {
	case LOUDNESS_MODE_SCAN:
		loudness_scan(files);
		break;
#ifdef USE_TAGLIB
	case LOUDNESS_MODE_TAG:
		ret = loudness_tag(files);
		break;
#endif
	case LOUDNESS_MODE_DUMP:
		ret = loudness_dump(files);
		break;
	}

	g_slist_foreach(files, filetree_free_list_entry, NULL);
	g_slist_free(files);

	filetree_destroy(tree);
	input_deinit();
	g_free(forced_plugin);

	return ret;
}